

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

float * get_half_cos_window(int block_size)

{
  float *pfVar1;
  int x;
  ulong uVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  pfVar1 = (float *)aom_malloc((ulong)(uint)(block_size * block_size) << 2);
  if (pfVar1 != (float *)0x0) {
    uVar5 = 0;
    uVar4 = 0;
    pfVar3 = pfVar1;
    if (0 < block_size) {
      uVar4 = (ulong)(uint)block_size;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      dVar6 = cos((((double)(int)uVar5 + 0.5) * 3.141592653589793) / (double)block_size +
                  -1.5707963267948966);
      for (uVar2 = 0; (uint)block_size != uVar2; uVar2 = uVar2 + 1) {
        dVar7 = cos((((double)(int)uVar2 + 0.5) * 3.141592653589793) / (double)block_size +
                    -1.5707963267948966);
        pfVar3[uVar2] = (float)(dVar7 * dVar6);
      }
      pfVar3 = pfVar3 + block_size;
    }
  }
  return pfVar1;
}

Assistant:

static float *get_half_cos_window(int block_size) {
  float *window_function =
      (float *)aom_malloc(block_size * block_size * sizeof(*window_function));
  if (!window_function) return NULL;
  for (int y = 0; y < block_size; ++y) {
    const double cos_yd = cos((.5 + y) * PI / block_size - PI / 2);
    for (int x = 0; x < block_size; ++x) {
      const double cos_xd = cos((.5 + x) * PI / block_size - PI / 2);
      window_function[y * block_size + x] = (float)(cos_yd * cos_xd);
    }
  }
  return window_function;
}